

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastF32R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort *puVar1;
  char cVar2;
  uint uVar3;
  RepeatedField<unsigned_int> *this;
  ulong uVar4;
  char *pcVar5;
  uint *puVar6;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  this = RefAt<google::protobuf::RepeatedField<unsigned_int>>(msg,(ulong)data.field_0 >> 0x30);
  cVar2 = *ptr;
  do {
    RepeatedField<unsigned_int>::Add(this,*(uint *)((long)ptr + 1));
    puVar1 = (ushort *)((long)ptr + 5);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar1) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar6 = *puVar6 | (uint)hasbits;
      }
      return (char *)((long)ptr + 5);
    }
    ptr = (char *)puVar1;
  } while (*(char *)puVar1 == cVar2);
  uVar3 = (uint)table->fast_idx_mask & (uint)*puVar1;
  if ((uVar3 & 7) == 0) {
    uVar4 = (ulong)(uVar3 & 0xfffffff8);
    pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar1,ctx,
                                (ulong)*puVar1 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,hasbits);
    return pcVar5;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF32R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedFixed<uint32_t, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}